

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O3

void __thiscall LengauerTarjan::COMPRESS(LengauerTarjan *this,int v)

{
  int v_00;
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  
  piVar1 = (this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  v_00 = piVar1[v];
  if (((long)v_00 != -1) && (piVar1[v_00] != -1)) {
    COMPRESS(this,v_00);
    piVar1 = (this->semi).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->ancestor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)piVar2[v];
    piVar3 = (this->label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1[piVar3[lVar4]] < piVar1[piVar3[v]]) {
      piVar3[v] = piVar3[lVar4];
      lVar4 = (long)piVar2[v];
    }
    piVar2[v] = piVar2[lVar4];
  }
  return;
}

Assistant:

void LengauerTarjan::COMPRESS(int v) {
	if (ancestor[v] == -1) {
		return;
	}
	if (ancestor[ancestor[v]] != -1) {
		COMPRESS(ancestor[v]);
		if (semi[label[ancestor[v]]] < semi[label[v]]) {
			label[v] = label[ancestor[v]];
		}
		ancestor[v] = ancestor[ancestor[v]];
	}
}